

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

void __thiscall
capnp::compiler::NodeTranslator::compileValue
          (NodeTranslator *this,Reader source,Reader type,Schema typeScope,Builder target,
          bool isBootstrap)

{
  ushort uVar1;
  Type type_00;
  undefined8 uVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  StringPtr name;
  ReaderFor<DynamicEnum> RVar6;
  ResolverGlue glue;
  undefined1 local_120 [72];
  Schema local_d8;
  SegmentBuilder *local_d0;
  anon_union_16_9_7f184501_for_Orphan<capnp::DynamicValue>_2 aStack_c8;
  OrphanBuilder local_b8;
  StructSchema local_98;
  ValueTranslator local_90;
  Resolver local_70;
  NodeTranslator *local_68;
  undefined1 local_60;
  PointerReader local_58;
  
  local_90.resolver = &local_70;
  local_70._vptr_Resolver = (_func_int **)&PTR_Reader__006d55e0;
  local_90.orphanage.capTable = (this->orphanage).capTable;
  local_90.errorReporter = this->errorReporter;
  local_90.orphanage.arena = (this->orphanage).arena;
  local_68 = this;
  local_60 = isBootstrap;
  (*this->resolver->_vptr_Resolver[10])(local_120,this->resolver,typeScope.raw);
  uVar2 = local_120._8_8_;
  if (local_120[0] != false) {
    type_00.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)local_120._16_8_;
    type_00.baseType = local_120._8_2_;
    type_00.listDepth = local_120[10];
    type_00.isImplicitParam = (bool)local_120[0xb];
    type_00.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_120._12_2_;
    type_00._6_2_ = local_120._14_2_;
    local_98.super_Schema.raw = (Schema)((long)schemas::s_d07378ede1f9cc60 + 0x48);
    StructSchema::getUnionFields((FieldSubset *)local_120,&local_98);
    local_d8.raw = (RawBrandedSchema *)local_120._0_8_;
    uVar4 = (uint)uVar2;
    uVar3 = 0xe;
    if ((uVar2 & 0xff0000) == 0) {
      uVar3 = (ulong)(uVar4 & 0xffff);
    }
    uVar1 = *(ushort *)(local_120._56_8_ + uVar3 * 2);
    capnp::_::ListReader::getStructElement
              ((StructReader *)&aStack_c8.enumValue,(ListReader *)(local_120 + 8),(uint)uVar1);
    local_d0 = (SegmentBuilder *)CONCAT44(local_d0._4_4_,(uint)uVar1);
    bVar5 = local_b8.capTable._4_2_ == 0;
    local_58.pointer = (WirePointer *)local_b8.segment;
    if (bVar5) {
      local_58.pointer = (WirePointer *)(SegmentBuilder *)0x0;
    }
    local_58.nestingLimit = 0x7fffffff;
    if (!bVar5) {
      local_58.nestingLimit = (int)local_b8.location;
    }
    local_58.segment._0_4_ = 0;
    local_58.segment._4_4_ = 0;
    local_58.capTable._0_4_ = 0;
    local_58.capTable._4_4_ = 0;
    if (!bVar5) {
      local_58.segment._0_4_ = aStack_c8.intValue._0_4_;
      local_58.segment._4_4_ = aStack_c8.intValue._4_4_;
      local_58.capTable._0_4_ = aStack_c8._8_4_;
      local_58.capTable._4_4_ = aStack_c8._12_4_;
    }
    name.content = (ArrayPtr<const_char>)
                   capnp::_::PointerReader::getBlob<capnp::Text>(&local_58,(void *)0x0,0);
    ValueTranslator::compileValue
              ((Maybe<capnp::Orphan<capnp::DynamicValue>_> *)local_120,&local_90,source,type_00);
    local_d8.raw._0_1_ = local_120[0];
    if (local_120[0] != false) {
      aStack_c8.listSchema.elementType.field_4 =
           (anon_union_8_2_eba6ea51_for_Type_5)local_120._24_8_;
      local_b8.tag.content = local_120._32_8_;
      local_d0 = (SegmentBuilder *)local_120._8_8_;
      aStack_c8.intValue = local_120._16_8_;
      local_b8.segment = (SegmentBuilder *)local_120._40_8_;
      local_b8.capTable = (CapTableBuilder *)local_120._48_8_;
      local_b8.location = (word *)local_120._56_8_;
      if ((uVar4 & 0xffffff) == 0xf) {
        Orphan<capnp::DynamicValue>::getReader
                  ((Reader *)local_120,(Orphan<capnp::DynamicValue> *)&local_d0);
        RVar6 = DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply
                          ((Reader *)local_120);
        *(undefined2 *)target._builder.data = 0xf;
        *(uint16_t *)((long)target._builder.data + 2) = RVar6.value;
        DynamicValue::Reader::~Reader((Reader *)local_120);
      }
      else {
        local_120._40_4_ = target._builder.dataSize;
        local_120._44_2_ = target._builder.pointerCount;
        local_120._46_2_ = target._builder._38_2_;
        local_120._24_8_ = target._builder.data;
        local_120._32_8_ = target._builder.pointers;
        local_120._8_8_ = target._builder.segment;
        local_120._16_8_ = target._builder.capTable;
        local_120._0_8_ = (long)schemas::s_ce23dcd2d7b00c9b + 0x48;
        DynamicStruct::Builder::adopt
                  ((Builder *)local_120,name,(Orphan<capnp::DynamicValue> *)&local_d0);
      }
    }
    if (((char)local_d8.raw == '\x01') && (local_b8.segment != (SegmentBuilder *)0x0)) {
      capnp::_::OrphanBuilder::euthanize(&local_b8);
    }
  }
  return;
}

Assistant:

void NodeTranslator::compileValue(Expression::Reader source, schema::Type::Reader type,
                                  Schema typeScope, schema::Value::Builder target,
                                  bool isBootstrap) {
  class ResolverGlue: public ValueTranslator::Resolver {
  public:
    inline ResolverGlue(NodeTranslator& translator, bool isBootstrap)
        : translator(translator), isBootstrap(isBootstrap) {}

    kj::Maybe<DynamicValue::Reader> resolveConstant(Expression::Reader name) override {
      return translator.readConstant(name, isBootstrap);
    }

    kj::Maybe<kj::Array<const byte>> readEmbed(LocatedText::Reader filename) override {
      return translator.readEmbed(filename);
    }

  private:
    NodeTranslator& translator;
    bool isBootstrap;
  };

  ResolverGlue glue(*this, isBootstrap);
  ValueTranslator valueTranslator(glue, errorReporter, orphanage);

  KJ_IF_SOME(typeSchema, resolver.resolveBootstrapType(type, typeScope)) {
    kj::StringPtr fieldName = Schema::from<schema::Type>()
        .getUnionFields()[static_cast<uint>(typeSchema.which())].getProto().getName();

    KJ_IF_SOME(value, valueTranslator.compileValue(source, typeSchema)) {
      if (typeSchema.isEnum()) {
        target.setEnum(value.getReader().as<DynamicEnum>().getRaw());
      } else {
        toDynamic(target).adopt(fieldName, kj::mv(value));
      }
    }
  }
}